

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::BindContext::GetBinding(BindContext *this,BindingAlias *alias,ErrorData *out_error)

{
  reference pvVar1;
  BinderException *this_00;
  Binding *pBVar2;
  vector<std::reference_wrapper<duckdb::Binding>,_true> matching_bindings;
  string helper_message;
  undefined1 local_c0 [24];
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  GetBindings((vector<std::reference_wrapper<duckdb::Binding>,_true> *)local_c0,this,alias,out_error
             );
  if (local_c0._0_8_ == local_c0._8_8_) {
    pBVar2 = (Binding *)0x0;
  }
  else {
    if (8 < (ulong)(local_c0._8_8_ - local_c0._0_8_)) {
      AmbiguityException_abi_cxx11_
                (&local_68,(BindContext *)alias,(BindingAlias *)local_c0,
                 (vector<std::reference_wrapper<duckdb::Binding>,_true> *)out_error);
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_a8._M_dataplus._M_p = local_c0 + 0x28;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c0 + 0x18),"Ambiguous reference to table \"%s\" %s","");
      BindingAlias::ToString_abi_cxx11_(&local_48,alias);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_68._M_dataplus._M_p,
                 local_68._M_string_length + local_68._M_dataplus._M_p);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (this_00,(string *)(local_c0 + 0x18),&local_48,&local_88);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<std::reference_wrapper<duckdb::Binding>,_true>::operator[]
                       ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)local_c0,0);
    pBVar2 = pvVar1->_M_data;
  }
  if ((pointer)local_c0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c0._0_8_);
  }
  return (optional_ptr<duckdb::Binding,_true>)pBVar2;
}

Assistant:

optional_ptr<Binding> BindContext::GetBinding(const BindingAlias &alias, ErrorData &out_error) {
	auto matching_bindings = GetBindings(alias, out_error);
	if (matching_bindings.empty()) {
		return nullptr;
	}
	if (matching_bindings.size() > 1) {
		string helper_message = AmbiguityException(alias, matching_bindings);
		throw BinderException("Ambiguous reference to table \"%s\" %s", alias.ToString(), helper_message);
	}
	// found a single matching alias
	return &matching_bindings[0].get();
}